

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void concept_suite::forward_iterator_default_constructible(void)

{
  bool bVar1;
  initializer_list<int> __l;
  iterator a;
  iterator local_60;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = (pointer)0x160000000b;
  span.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&span;
  std::vector<int,_std::allocator<int>_>::vector(&data,__l,(allocator_type *)&a);
  span.member.data = (pointer)0x0;
  if ((long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    span.member.data =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
  }
  span.member.cap =
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  span.member.size = span.member.cap;
  span.member.next = span.member.cap;
  a = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_60 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&a,&local_60);
  boost::detail::test_impl
            ("a == b",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x84,"void concept_suite::forward_iterator_default_constructible()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_60,&a);
  boost::detail::test_impl
            ("b == a",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x85,"void concept_suite::forward_iterator_default_constructible()",bVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void forward_iterator_default_constructible()
{
    // Only valid operations on default constructed iterator are assignment and
    // destruction (see [iterator.requirements.general] / 7)

    static_assert(std::is_default_constructible<circular_view<int>::iterator>::value, "default constructible");

    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.begin();
    circular_view<int>::iterator b; // Singular value not associated with span
    b = span.begin();
    BOOST_TEST(a == b);
    BOOST_TEST(b == a);
}